

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

String * __thiscall
kj::_::anon_unknown_2::makeDescriptionImpl
          (String *__return_storage_ptr__,anon_unknown_2 *this,DescriptionStyle style,char *code,
          int errorNumber,char *sysErrorString,char *macroArgs,ArrayPtr<kj::String> argValues)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ArrayPtr<const_char> *pAVar4;
  ExceptionCallback *pEVar5;
  char *pcVar6;
  size_t sVar7;
  undefined4 in_register_00000014;
  String *pSVar8;
  String *pSVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  ArrayPtr<const_char> *argName;
  undefined4 in_register_00000084;
  size_t i;
  char *__s;
  size_t i_1;
  size_t sVar14;
  size_t size;
  char cVar15;
  long lVar16;
  long lVar17;
  ArrayPtr<const_char> *this_00;
  ArrayPtr<const_char> local_278;
  String *local_268;
  int local_25c;
  StringPtr local_258;
  StringPtr local_248;
  Array<kj::ArrayPtr<const_char>_> argNames_heap;
  StringPtr closeBracket;
  StringPtr openBracket;
  StringPtr delim;
  StringPtr sep;
  StringPtr expected;
  char *macroArgs_local;
  StringPtr colon;
  ArrayPtr<const_char> argNames_stack [8];
  char buffer [256];
  
  pcVar6 = (char *)CONCAT44(in_register_00000084,errorNumber);
  __s = (char *)CONCAT44(in_register_00000014,style);
  local_25c = (int)code;
  argNames_stack[7].ptr = (char *)0x0;
  argNames_stack[7].size_ = 0;
  argNames_stack[6].ptr = (char *)0x0;
  argNames_stack[6].size_ = 0;
  argNames_stack[5].ptr = (char *)0x0;
  argNames_stack[5].size_ = 0;
  argNames_stack[4].ptr = (char *)0x0;
  argNames_stack[4].size_ = 0;
  argNames_stack[3].ptr = (char *)0x0;
  argNames_stack[3].size_ = 0;
  argNames_stack[2].ptr = (char *)0x0;
  argNames_stack[2].size_ = 0;
  argNames_stack[1].ptr = (char *)0x0;
  argNames_stack[1].size_ = 0;
  argNames_stack[0].ptr = (char *)0x0;
  argNames_stack[0].size_ = 0;
  local_268 = __return_storage_ptr__;
  macroArgs_local = pcVar6;
  if (argValues.ptr < (String *)0x9) {
    argNames_heap.disposer = (ArrayDisposer *)0x0;
    argNames_heap.ptr = (ArrayPtr<const_char> *)0x0;
    argNames_heap.size_ = 0;
    pAVar4 = argNames_stack;
    if (argValues.ptr == (String *)0x0) goto LAB_002426db;
  }
  else {
    pAVar4 = HeapArrayDisposer::allocate<kj::ArrayPtr<char_const>>((size_t)argValues.ptr);
    argNames_heap.size_ = (size_t)argValues.ptr;
    argNames_heap.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
    argNames_heap.ptr = pAVar4;
  }
  pcVar6 = pcVar6 + -1;
  do {
    cVar15 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
    iVar2 = isspace((int)cVar15);
  } while (iVar2 != 0);
  iVar2 = 0;
  bVar1 = false;
  pSVar8 = (String *)0x0;
  pcVar11 = pcVar6;
LAB_0024257d:
  pcVar13 = pcVar11 + 1;
  pSVar9 = pSVar8;
  if (cVar15 == '\0') goto LAB_00242641;
  pcVar12 = pcVar13;
  if (bVar1) {
    if (cVar15 != '\"') {
      bVar1 = true;
      if ((cVar15 == '\\') && (pcVar12 = pcVar11 + 2, pcVar11[1] == '\0')) {
        pcVar12 = pcVar13;
      }
      goto LAB_00242635;
    }
  }
  else {
    if (cVar15 == '\"') {
      bVar1 = true;
      goto LAB_00242635;
    }
    if (cVar15 == ')') {
      iVar2 = iVar2 + -1;
    }
    else {
      if (cVar15 != '(') {
        if (iVar2 != 0 || cVar15 != ',') goto LAB_00242630;
        if (pSVar8 < argValues.ptr) {
          pSVar9 = (String *)((long)&(pSVar8->content).ptr + 1);
          pAVar4[(long)pSVar8].ptr = pcVar6;
          pAVar4[(long)pSVar8].size_ = (long)pcVar11 - (long)pcVar6;
        }
        do {
          cVar15 = pcVar11[1];
          pcVar6 = pcVar11 + 1;
          iVar2 = isspace((int)cVar15);
          pcVar11 = pcVar6;
        } while (iVar2 != 0);
        iVar2 = 0;
        bVar1 = false;
        pSVar8 = pSVar9;
        pcVar12 = pcVar6;
        pcVar13 = pcVar6;
        if (cVar15 != '\0') goto LAB_00242635;
        goto LAB_00242641;
      }
      iVar2 = iVar2 + 1;
    }
  }
LAB_00242630:
  bVar1 = false;
LAB_00242635:
  cVar15 = *pcVar12;
  pcVar11 = pcVar12;
  goto LAB_0024257d;
LAB_00242641:
  pSVar8 = pSVar9;
  if (pSVar9 < argValues.ptr) {
    pSVar8 = (String *)((long)&(pSVar9->content).ptr + 1);
    pAVar4[(long)pSVar9].ptr = pcVar6;
    pAVar4[(long)pSVar9].size_ = (size_t)(pcVar13 + ~(ulong)pcVar6);
  }
  if (pSVar8 != argValues.ptr) {
    pEVar5 = getExceptionCallback();
    expected.content.ptr = (char *)argValues.ptr;
    local_248.content.ptr = (char *)CONCAT71(local_248.content.ptr._1_7_,10);
    str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
              ((String *)buffer,(kj *)"Failed to parse logging macro args into ",
               (char (*) [41])&expected,(unsigned_long *)" names: ",(char (*) [9])&macroArgs_local,
               (char **)&local_248,(char *)pAVar4);
    (*pEVar5->_vptr_ExceptionCallback[4])
              (pEVar5,2,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug.c++"
               ,0xdd,0,buffer);
    Array<char>::~Array((Array<char> *)buffer);
  }
LAB_002426db:
  iVar2 = (int)this;
  if (((iVar2 == 2) && (pcVar6 = strchr(__s,0x3d), pcVar6 != (char *)0x0)) && (pcVar6[1] != '=')) {
    do {
      __s = pcVar6 + 1;
      iVar3 = isspace((int)pcVar6[1]);
      pcVar6 = __s;
    } while (iVar3 != 0);
  }
  iVar3 = 0;
  if (__s != (char *)0x0) {
    iVar3 = iVar2;
  }
  if (iVar2 != 1) {
    iVar3 = iVar2;
  }
  expected.content.ptr = "expected ";
  expected.content.size_ = 10;
  if (iVar3 == 0) {
    sVar14 = 1;
    __s = "";
  }
  else {
    sVar7 = strlen(__s);
    sVar14 = sVar7 + 1;
  }
  sep.content.ptr = " = ";
  sep.content.size_ = 4;
  delim.content.ptr = "; ";
  delim.content.size_ = 3;
  colon.content.ptr = ": ";
  colon.content.size_ = 3;
  openBracket.content.ptr = " [";
  openBracket.content.size_ = 3;
  closeBracket.content.ptr = "]";
  closeBracket.content.size_ = 2;
  local_258.content.ptr = "";
  local_258.content.size_ = 1;
  size = 0;
  local_248.content.ptr = __s;
  local_248.content.size_ = sVar14;
  memset(buffer,0,0x100);
  if (iVar3 == 2) {
    pcVar6 = strerror_r(local_25c,buffer,0x100);
    sVar7 = strlen(pcVar6);
    local_258.content.size_ = sVar7 + 1;
    size = sVar7 + sVar14 + 1;
    local_258.content.ptr = pcVar6;
  }
  else if (iVar3 == 1) {
    size = sVar14 + 8;
  }
  lVar16 = 0;
  this_00 = pAVar4;
  for (pSVar8 = (String *)0x0; pSVar9 = local_268, pSVar8 < argValues.ptr;
      pSVar8 = (String *)((long)&(pSVar8->content).ptr + 1)) {
    local_278.ptr = "_kjCondition";
    local_278.size_ = 0xc;
    argName = &local_278;
    bVar1 = ArrayPtr<const_char>::operator==(pAVar4,&local_278);
    if (bVar1) {
      local_278.ptr = "false";
      local_278.size_ = 6;
      bVar1 = String::operator==((String *)(macroArgs + lVar16),(StringPtr *)&local_278);
      if (!bVar1) {
        lVar17 = 0;
        if (*(long *)(macroArgs + lVar16 + 8) != 0) {
          lVar17 = *(long *)(macroArgs + lVar16 + 8) + -1;
        }
        size = (size + openBracket.content.size_ + lVar17 + closeBracket.content.size_) - 2;
      }
    }
    else {
      lVar17 = delim.content.size_ - 1;
      if (pSVar8 == (String *)0x0) {
        lVar17 = 0;
      }
      if (iVar3 != 0) {
        lVar17 = delim.content.size_ - 1;
      }
      bVar1 = makeDescriptionImpl::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)pAVar4,argName);
      lVar17 = lVar17 + size;
      if (bVar1) {
        lVar17 = lVar17 + pAVar4->size_ + sep.content.size_ + -1;
      }
      lVar10 = 0;
      if (*(long *)(macroArgs + lVar16 + 8) != 0) {
        lVar10 = *(long *)(macroArgs + lVar16 + 8) + -1;
      }
      size = lVar10 + lVar17;
    }
    lVar16 = lVar16 + 0x18;
    pAVar4 = pAVar4 + 1;
  }
  heapString(local_268,size);
  pcVar6 = (char *)(pSVar9->content).size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (pSVar9->content).ptr;
  }
  if (iVar3 == 1) {
    pcVar6 = fill<kj::StringPtr,kj::StringPtr&>(pcVar6,&expected,&local_248);
  }
  else if (iVar3 == 2) {
    pcVar6 = fill<kj::StringPtr,kj::StringPtr&,kj::StringPtr&>(pcVar6,&local_248,&colon,&local_258);
  }
  lVar16 = 0;
  for (pSVar8 = (String *)0x0; pSVar8 < argValues.ptr;
      pSVar8 = (String *)((long)&(pSVar8->content).ptr + 1)) {
    local_278.ptr = "_kjCondition";
    local_278.size_ = 0xc;
    pAVar4 = &local_278;
    bVar1 = ArrayPtr<const_char>::operator==(this_00,&local_278);
    if (bVar1) {
      local_278.ptr = "false";
      local_278.size_ = 6;
      bVar1 = String::operator==((String *)(macroArgs + lVar16),(StringPtr *)&local_278);
      if (!bVar1) {
        pcVar6 = fill<kj::StringPtr,kj::String&,kj::StringPtr&>
                           (pcVar6,&openBracket,(String *)(macroArgs + lVar16),&closeBracket);
      }
    }
    else {
      if (iVar3 != 0 || pSVar8 != (String *)0x0) {
        pAVar4 = &delim.content;
        pcVar6 = fill<kj::StringPtr>(pcVar6,(StringPtr *)pAVar4);
      }
      bVar1 = makeDescriptionImpl::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)this_00,pAVar4);
      if (bVar1) {
        pcVar6 = fill<kj::ArrayPtr<char_const>,kj::StringPtr&>(pcVar6,this_00,&sep);
      }
      pcVar6 = fill<kj::String>(pcVar6,(String *)(macroArgs + lVar16));
    }
    lVar16 = lVar16 + 0x18;
    this_00 = this_00 + 1;
  }
  Array<kj::ArrayPtr<const_char>_>::~Array(&argNames_heap);
  return local_268;
}

Assistant:

static String makeDescriptionImpl(DescriptionStyle style, const char* code, int errorNumber,
                                  const char* sysErrorString, const char* macroArgs,
                                  ArrayPtr<String> argValues) {
  KJ_STACK_ARRAY(ArrayPtr<const char>, argNames, argValues.size(), 8, 64);

  if (argValues.size() > 0) {
    size_t index = 0;
    const char* start = macroArgs;
    while (isspace(*start)) ++start;
    const char* pos = start;
    uint depth = 0;
    bool quoted = false;
    while (char c = *pos++) {
      if (quoted) {
        if (c == '\\' && *pos != '\0') {
          ++pos;
        } else if (c == '\"') {
          quoted = false;
        }
      } else {
        if (c == '(') {
          ++depth;
        } else if (c == ')') {
          --depth;
        } else if (c == '\"') {
          quoted = true;
        } else if (c == ',' && depth == 0) {
          if (index < argValues.size()) {
            argNames[index++] = arrayPtr(start, pos - 1);
          }
          while (isspace(*pos)) ++pos;
          start = pos;
          if (*pos == '\0') {
            // ignore trailing comma
            break;
          }
        }
      }
    }
    if (index < argValues.size()) {
      argNames[index++] = arrayPtr(start, pos - 1);
    }

    if (index != argValues.size()) {
      getExceptionCallback().logMessage(LogSeverity::ERROR, __FILE__, __LINE__, 0,
          str("Failed to parse logging macro args into ",
              argValues.size(), " names: ", macroArgs, '\n'));
    }
  }

  if (style == SYSCALL) {
    // Strip off leading "foo = " from code, since callers will sometimes write things like:
    //   ssize_t n;
    //   RECOVERABLE_SYSCALL(n = read(fd, buffer, sizeof(buffer))) { return ""; }
    //   return std::string(buffer, n);
    const char* equalsPos = strchr(code, '=');
    if (equalsPos != nullptr && equalsPos[1] != '=') {
      code = equalsPos + 1;
      while (isspace(*code)) ++code;
    }
  }

  if (style == ASSERTION && code == nullptr) {
    style = LOG;
  }

  {
    StringPtr expected = "expected ";
    StringPtr codeArray = style == LOG ? nullptr : StringPtr(code);
    StringPtr sep = " = ";
    StringPtr delim = "; ";
    StringPtr colon = ": ";
    StringPtr openBracket = " [";
    StringPtr closeBracket = "]";

    StringPtr sysErrorArray;
// On android before marshmallow only the posix version of stderror_r was
// available, even with __USE_GNU.
#if __USE_GNU && !(defined(__ANDROID_API__) && __ANDROID_API__ < 23)
    char buffer[256]{};
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        sysErrorArray = strerror_r(errorNumber, buffer, sizeof(buffer));
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#else
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        strerror_r(errorNumber, buffer, sizeof(buffer));
        sysErrorArray = buffer;
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#endif

    size_t totalSize = 0;
    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        totalSize += expected.size() + codeArray.size();
        break;
      case SYSCALL:
        totalSize += codeArray.size() + colon.size() + sysErrorArray.size();
        break;
    }

    auto needsLabel = [](const ArrayPtr<const char> &argName) -> bool {
      return argName.size() > 0 && argName[0] != '\"' && !argName.startsWith("kj::str("_kjc);
    };

    for (size_t i = 0; i < argValues.size(); i++) {
      if (argNames[i] == "_kjCondition"_kj) {
        // Special handling: don't output delimiter, we want to append this to the previous item,
        // in brackets. Also, if it's just "[false]" (meaning we didn't manage to extract a
        // comparison), don't add it at all.
        if (argValues[i] != "false") {
          totalSize += openBracket.size() + argValues[i].size() + closeBracket.size();
        }
        continue;
      }

      if (i > 0 || style != LOG) {
        totalSize += delim.size();
      }
      if (needsLabel(argNames[i])) {
        totalSize += argNames[i].size() + sep.size();
      }
      totalSize += argValues[i].size();
    }

    String result = heapString(totalSize);
    char* pos = result.begin();

    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        pos = _::fill(pos, expected, codeArray);
        break;
      case SYSCALL:
        pos = _::fill(pos, codeArray, colon, sysErrorArray);
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (argNames[i] == "_kjCondition"_kj) {
        // Special handling: don't output delimiter, we want to append this to the previous item,
        // in brackets. Also, if it's just "[false]" (meaning we didn't manage to extract a
        // comparison), don't add it at all.
        if (argValues[i] != "false") {
          pos = _::fill(pos, openBracket, argValues[i], closeBracket);
        }
        continue;
      }

      if (i > 0 || style != LOG) {
        pos = _::fill(pos, delim);
      }
      if (needsLabel(argNames[i])) {
        pos = _::fill(pos, argNames[i], sep);
      }
      pos = _::fill(pos, argValues[i]);
    }

    return result;
  }
}